

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void __thiscall wasm_functype_t::wasm_functype_t(wasm_functype_t *this,FuncType *ft)

{
  undefined1 local_28 [8];
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_20;
  FuncType *local_18;
  FuncType *ft_local;
  wasm_functype_t *this_local;
  
  local_18 = ft;
  ft_local = (FuncType *)this;
  std::make_unique<wabt::interp::FuncType,wabt::interp::FuncType&>((FuncType *)local_28);
  std::unique_ptr<wabt::interp::ExternType,std::default_delete<wabt::interp::ExternType>>::
  unique_ptr<wabt::interp::FuncType,std::default_delete<wabt::interp::FuncType>,void>
            ((unique_ptr<wabt::interp::ExternType,std::default_delete<wabt::interp::ExternType>> *)
             &local_20,
             (unique_ptr<wabt::interp::FuncType,_std::default_delete<wabt::interp::FuncType>_> *)
             local_28);
  wasm_externtype_t::wasm_externtype_t(&this->super_wasm_externtype_t,&local_20);
  std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
  ~unique_ptr(&local_20);
  std::unique_ptr<wabt::interp::FuncType,_std::default_delete<wabt::interp::FuncType>_>::~unique_ptr
            ((unique_ptr<wabt::interp::FuncType,_std::default_delete<wabt::interp::FuncType>_> *)
             local_28);
  (this->super_wasm_externtype_t)._vptr_wasm_externtype_t =
       (_func_int **)&PTR__wasm_functype_t_0043ebd0;
  FromWabtValueTypes(&ft->params,&this->params);
  FromWabtValueTypes(&ft->results,&this->results);
  return;
}

Assistant:

wasm_functype_t(FuncType ft)
      : wasm_externtype_t{std::make_unique<FuncType>(ft)} {
    FromWabtValueTypes(ft.params, &params);
    FromWabtValueTypes(ft.results, &results);
  }